

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

LinTerms * mp::MergeSorted<mp::LinTerms>(LinTerms *t1,LinTerms *t2)

{
  double dVar1;
  pair<int,_double> iv;
  pair<int,_double> iv_00;
  pair<int,_double> iv_01;
  size_t sVar2;
  LinTerms *pLVar3;
  LinTerms *pLVar4;
  LinTerms *in_RDI;
  pair<int,_double> pVar5;
  pair<int,_double> pVar6;
  pair<int,_double> t2i_1;
  pair<int,_double> t1i_1;
  pair<int,_double> t2i;
  pair<int,_double> t1i;
  size_t i2;
  size_t i1;
  LinTerms *result;
  size_t in_stack_fffffffffffffe98;
  LinTerms *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  LinTerms *in_stack_fffffffffffffeb0;
  LinTerms *local_40;
  ulong local_38;
  
  LinTerms::LinTerms(in_stack_fffffffffffffea0);
  LinTerms::size((LinTerms *)0x70a4e9);
  LinTerms::size((LinTerms *)0x70a4fe);
  LinTerms::reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_38 = 0;
  local_40 = (LinTerms *)0x0;
  while ((sVar2 = LinTerms::size((LinTerms *)0x70a54c), local_38 < sVar2 &&
         (pLVar3 = (LinTerms *)LinTerms::size((LinTerms *)0x70a577), local_40 < pLVar3))) {
    pVar5 = LinTerms::IndexValue
                      (in_stack_fffffffffffffeb0,
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    pVar6 = LinTerms::IndexValue
                      (in_stack_fffffffffffffeb0,
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (pVar5.first < pVar6.first) {
      iv.second = (double)in_stack_fffffffffffffea0;
      iv._0_8_ = in_stack_fffffffffffffe98;
      LinTerms::add_index_value((LinTerms *)0x70a63b,iv);
      local_38 = local_38 + 1;
    }
    else {
      if (pVar6.first < pVar5.first) {
        pVar6.second = (double)in_stack_fffffffffffffea0;
        pVar6._0_8_ = in_stack_fffffffffffffe98;
        LinTerms::add_index_value((LinTerms *)0x70a6b9,pVar6);
      }
      else {
        dVar1 = pVar6.second + pVar5.second;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          pVar5.second = (double)in_stack_fffffffffffffea0;
          pVar5._0_8_ = in_stack_fffffffffffffe98;
          LinTerms::add_index_value((LinTerms *)0x70a732,pVar5);
        }
        local_38 = local_38 + 1;
      }
      local_40 = (LinTerms *)
                 ((long)&(local_40->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
                         m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr + 1
                 );
    }
  }
  sVar2 = LinTerms::size((LinTerms *)0x70a77f);
  if (local_38 < sVar2) {
    for (; sVar2 = LinTerms::size((LinTerms *)0x70a7ac), local_38 < sVar2; local_38 = local_38 + 1)
    {
      LinTerms::IndexValue
                (in_stack_fffffffffffffeb0,
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      iv_00.second = (double)in_stack_fffffffffffffea0;
      iv_00._0_8_ = in_stack_fffffffffffffe98;
      LinTerms::add_index_value((LinTerms *)0x70a825,iv_00);
    }
  }
  else {
    pLVar3 = (LinTerms *)LinTerms::size((LinTerms *)0x70a861);
    if (local_40 < pLVar3) {
      while (pLVar3 = local_40, pLVar4 = (LinTerms *)LinTerms::size((LinTerms *)0x70a88e),
            pLVar3 < pLVar4) {
        pVar5 = LinTerms::IndexValue
                          (pLVar3,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        in_stack_fffffffffffffeac = pVar5.first;
        iv_01.second = pVar5.second;
        iv_01._0_8_ = in_stack_fffffffffffffe98;
        LinTerms::add_index_value((LinTerms *)0x70a907,iv_01);
        local_40 = (LinTerms *)
                   ((long)&(local_40->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
                           m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr +
                   1);
      }
    }
  }
  return in_RDI;
}

Assistant:

Terms MergeSorted(const Terms& t1, const Terms& t2) {
  assert(t1.is_sorted());
  assert(t2.is_sorted());
  Terms result;
  result.reserve(t1.size() + t2.size());

  size_t i1=0, i2=0;
  while (true) {
    if (i1<t1.size() && i2<t2.size()) {
      auto t1i = t1.IndexValue(i1);
      auto t2i = t2.IndexValue(i2);
      if (t1i.first < t2i.first) {
        result.add_index_value(t1i);
        ++i1;
      } else if (t1i.first > t2i.first) {
        result.add_index_value(t2i);
        ++i2;
      } else {
        t1i.second += t2i.second;
        if (t1i.second)
          result.add_index_value(t1i);
        ++i1;
        ++i2;
      }
    } else if (i1<t1.size()) {
      for ( ; i1<t1.size(); ++i1) {
        auto t1i = t1.IndexValue(i1);
        result.add_index_value(t1i);
      }
      break;
    } else if (i2<t2.size()) {
      for ( ; i2<t2.size(); ++i2) {
        auto t2i = t2.IndexValue(i2);
        result.add_index_value(t2i);
      }
      break;
    } else
      break;
  }

  return result;
}